

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cc
# Opt level: O3

void fasttext::utils::initLog(void)

{
  int i;
  long lVar1;
  float fVar2;
  
  if (t_log == (void *)0x0) {
    t_log = operator_new__(0x804);
    lVar1 = 0;
    do {
      fVar2 = logf(((float)(int)lVar1 + 1e-05) * 0.001953125);
      *(float *)((long)t_log + lVar1 * 4) = fVar2;
      lVar1 = lVar1 + 1;
    } while (lVar1 != 0x201);
  }
  return;
}

Assistant:

void initLog() {
    if (t_log != nullptr) return;
    t_log = new real[LOG_TABLE_SIZE + 1];
    for (int i = 0; i < LOG_TABLE_SIZE + 1; i++) {
      real x = (real(i) + 1e-5) / LOG_TABLE_SIZE;
      t_log[i] = std::log(x);
    }
  }